

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool __thiscall Analyzer::nameLooksLikeFunctionMustReturnResult(Analyzer *this,char *name)

{
  bool bVar1;
  char *pcVar2;
  
  if ((name != (char *)0x0) && (*name != '\0')) {
    bVar1 = nameLooksLikeResultMustBeBoolean(this,name);
    if (bVar1) {
      return true;
    }
    bVar1 = settings::has_prefix
                      (name,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)settings::function_should_return_something_prefix_abi_cxx11_);
    if (bVar1) {
      return true;
    }
    pcVar2 = strstr(name,"_ctor");
    if ((pcVar2 != (char *)0x0) || (pcVar2 = strstr(name,"Ctor"), pcVar2 != (char *)0x0)) {
      if (*name != 's') {
        return true;
      }
      if (name[1] != 'e') {
        return true;
      }
      return name[2] != 't';
    }
  }
  return false;
}

Assistant:

bool nameLooksLikeFunctionMustReturnResult(const char * name)
  {
    if (!name || !name[0])
      return false;

    bool nameInList = nameLooksLikeResultMustBeBoolean(name) ||
      settings::has_prefix(name, settings::function_should_return_something_prefix);

    if (!nameInList)
      if ((strstr(name, "_ctor") || strstr(name, "Ctor")) && strstr(name, "set") != name)
        nameInList = true;

    return nameInList;
  }